

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIntegerStateQueryTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::FramebufferMinimumValueCase::iterate
          (FramebufferMinimumValueCase *this)

{
  ulong uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  TestLog *pTVar4;
  bool bVar5;
  int iVar6;
  GLenum GVar7;
  undefined4 extraout_var;
  long *plVar8;
  undefined8 *puVar9;
  size_type *psVar10;
  ulong uVar11;
  undefined8 uVar12;
  ScopedLogSection section;
  ScopedLogSection section_1;
  CallLogWrapper gl;
  StateQueryMemoryWriteGuard<int> tiedToValue;
  ResultCollector result;
  ostringstream s;
  string local_2b8;
  ulong *local_298;
  long local_290;
  ulong local_288 [2];
  string local_278;
  string local_258;
  ScopedLogSection local_238;
  CallLogWrapper local_230;
  StateQueryMemoryWriteGuard<int> local_218;
  ResultCollector local_208;
  string local_1b8 [3];
  ios_base local_148 [264];
  code *local_40;
  GLenum local_38;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_230,(Functions *)CONCAT44(extraout_var,iVar6),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1b8[0]._M_dataplus._M_p = (pointer)&local_1b8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_208,pTVar4,local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
    operator_delete(local_1b8[0]._M_dataplus._M_p,local_1b8[0].field_2._M_allocated_capacity + 1);
  }
  local_230.m_enableLog = true;
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  paVar2 = &local_278.field_2;
  local_278._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"Minimum","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::ostream::operator<<(local_1b8,this->m_minValue);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,0x9923a9);
  paVar3 = &local_2b8.field_2;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_2b8.field_2._M_allocated_capacity = *psVar10;
    local_2b8.field_2._8_8_ = plVar8[3];
    local_2b8._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_2b8.field_2._M_allocated_capacity = *psVar10;
    local_2b8._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_2b8._M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_258,pTVar4,&local_278,&local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  gls::StateQueryUtil::verifyStateIntegerMin
            (&local_208,&local_230,this->m_target,this->m_minValue,this->m_verifierType);
  tcu::TestLog::endSection((TestLog *)local_258._M_dataplus._M_p);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_278._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"Ties","");
  local_258._M_string_length._0_4_ = this->m_tiedTo;
  local_258._M_dataplus._M_p = (pointer)glu::getGettableStateName;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_258,(ostream *)local_1b8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,0x9923c4);
  psVar10 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_2b8.field_2._M_allocated_capacity = *psVar10;
    local_2b8.field_2._8_8_ = puVar9[3];
    local_2b8._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_2b8.field_2._M_allocated_capacity = *psVar10;
    local_2b8._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_2b8._M_string_length = puVar9[1];
  *puVar9 = psVar10;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  tcu::ScopedLogSection::ScopedLogSection(&local_238,pTVar4,&local_278,&local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  local_218.m_preguard = -0x21212122;
  local_218.m_value = -0x21212122;
  local_218.m_postguard = -0x21212122;
  glu::CallLogWrapper::glGetIntegerv(&local_230,this->m_tiedTo,&local_218.m_value);
  GVar7 = glu::CallLogWrapper::glGetError(&local_230);
  if (GVar7 == 0) goto LAB_004d4f5e;
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"Got Error ","");
  local_40 = glu::getErrorName;
  local_38 = GVar7;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_258,&local_40);
  uVar1 = CONCAT44(local_258._M_string_length._4_4_,(GLenum)local_258._M_string_length) + local_290;
  uVar11 = 0xf;
  if (local_298 != local_288) {
    uVar11 = local_288[0];
  }
  if (uVar11 < uVar1) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      uVar12 = local_258.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < uVar1) goto LAB_004d4db1;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,(ulong)local_298);
  }
  else {
LAB_004d4db1:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_298,(ulong)local_258._M_dataplus._M_p);
  }
  psVar10 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_2b8.field_2._M_allocated_capacity = *psVar10;
    local_2b8.field_2._8_8_ = puVar9[3];
    local_2b8._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_2b8.field_2._M_allocated_capacity = *psVar10;
    local_2b8._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_2b8._M_string_length = puVar9[1];
  *puVar9 = psVar10;
  puVar9[1] = 0;
  *(undefined1 *)psVar10 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_2b8);
  psVar10 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_278.field_2._M_allocated_capacity = *psVar10;
    local_278.field_2._8_8_ = plVar8[3];
    local_278._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_278.field_2._M_allocated_capacity = *psVar10;
    local_278._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_278._M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_278);
  local_1b8[0]._M_dataplus._M_p = (pointer)&local_1b8[0].field_2;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_1b8[0].field_2._0_8_ = *psVar10;
    local_1b8[0].field_2._8_8_ = plVar8[3];
  }
  else {
    local_1b8[0].field_2._0_8_ = *psVar10;
    local_1b8[0]._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_1b8[0]._M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  tcu::ResultCollector::fail(&local_208,local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
    operator_delete(local_1b8[0]._M_dataplus._M_p,local_1b8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
LAB_004d4f5e:
  bVar5 = gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    (&local_218,&local_208);
  if (bVar5) {
    gls::StateQueryUtil::verifyStateIntegerMin
              (&local_208,&local_230,this->m_target,local_218.m_value,this->m_verifierType);
  }
  tcu::TestLog::endSection(local_238.m_log);
  tcu::ResultCollector::setTestContextResult
            (&local_208,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.m_message._M_dataplus._M_p != &local_208.m_message.field_2) {
    operator_delete(local_208.m_message._M_dataplus._M_p,
                    local_208.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.m_prefix._M_dataplus._M_p != &local_208.m_prefix.field_2) {
    operator_delete(local_208.m_prefix._M_dataplus._M_p,
                    local_208.m_prefix.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::~CallLogWrapper(&local_230);
  return STOP;
}

Assistant:

FramebufferMinimumValueCase::IterateResult FramebufferMinimumValueCase::iterate (void)
{
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	{
		const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Minimum", "Specified minimum is " + de::toString(m_minValue));

		verifyStateIntegerMin(result, gl, m_target, m_minValue, m_verifierType);
	}
	{
		const tcu::ScopedLogSection				section		(m_testCtx.getLog(), "Ties", "The limit is tied to the value of " + de::toString(glu::getGettableStateStr(m_tiedTo)));
		StateQueryMemoryWriteGuard<glw::GLint>	tiedToValue;

		gl.glGetIntegerv(m_tiedTo, &tiedToValue);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

		if (tiedToValue.verifyValidity(result))
			verifyStateIntegerMin(result, gl, m_target, tiedToValue, m_verifierType);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}